

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resSim.c
# Opt level: O2

void Res_SimPerformRound(Res_Sim_t *p,int nWords)

{
  void *__s;
  Abc_Obj_t *pAVar1;
  int iVar2;
  Abc_Ntk_t *pNtk;
  char *__assertion;
  
  iVar2 = 0;
  __s = Vec_PtrEntry(p->vPats,0);
  memset(__s,0xff,(long)nWords << 2);
  do {
    pNtk = p->pAig;
    if (pNtk->vObjs->nSize <= iVar2) {
      for (iVar2 = 0; iVar2 < pNtk->vPos->nSize; iVar2 = iVar2 + 1) {
        pAVar1 = Abc_NtkPo(pNtk,iVar2);
        Res_SimTransferOne(pAVar1,p->vPats,nWords);
        pNtk = p->pAig;
      }
      return;
    }
    pAVar1 = (Abc_Obj_t *)Vec_PtrEntry(pNtk->vObjs,iVar2);
    if (pAVar1 != (Abc_Obj_t *)0x0) {
      if (((ulong)pAVar1 & 1) != 0) {
        __assertion = "!Abc_ObjIsComplement(pNode)";
LAB_003ca805:
        __assert_fail(__assertion,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abc/abc.h"
                      ,0x18e,"int Abc_AigNodeIsAnd(Abc_Obj_t *)");
      }
      if (pAVar1->pNtk->ntkType != ABC_NTK_STRASH) {
        __assertion = "Abc_NtkIsStrash(pNode->pNtk)";
        goto LAB_003ca805;
      }
      if ((pAVar1->vFanins).nSize == 2) {
        Res_SimPerformOne(pAVar1,p->vPats,nWords);
      }
    }
    iVar2 = iVar2 + 1;
  } while( true );
}

Assistant:

void Res_SimPerformRound( Res_Sim_t * p, int nWords )
{
    Abc_Obj_t * pObj;
    int i;
    Abc_InfoFill( (unsigned *)Vec_PtrEntry(p->vPats,0), nWords );
    Abc_AigForEachAnd( p->pAig, pObj, i )
        Res_SimPerformOne( pObj, p->vPats, nWords );
    Abc_NtkForEachPo( p->pAig, pObj, i )
        Res_SimTransferOne( pObj, p->vPats, nWords );
}